

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

void Image_Function::LookupTable
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *table)

{
  byte bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  size_type sVar4;
  undefined8 uVar5;
  uchar *puVar6;
  byte *pbVar7;
  uchar *puVar8;
  uchar *puVar9;
  const_reference pvVar10;
  ImageTemplate<unsigned_char> *in_RCX;
  int in_EDX;
  int in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000018;
  uint8_t *outXEnd;
  uint8_t *outX;
  uint8_t *inX;
  uint8_t *outYEnd;
  uint8_t *outY;
  uint8_t *inY;
  uint32_t rowSizeOut;
  uint32_t rowSizeIn;
  uint8_t colorCount;
  int iVar11;
  undefined4 in_stack_ffffffffffffff4c;
  int iVar12;
  undefined4 in_stack_ffffffffffffff54;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff58;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff80;
  uint32_t in_stack_ffffffffffffff90;
  uchar *puVar13;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff98;
  byte *pbVar14;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint32_t *in_stack_ffffffffffffffa8;
  uint32_t *in_stack_ffffffffffffffb0;
  
  iVar11 = in_stack_00000008;
  iVar12 = in_stack_00000010;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff80,(uint32_t)((ulong)in_stack_ffffffffffffff78 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             (uint32_t)((ulong)in_stack_ffffffffffffff68 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff68,in_stack_ffffffffffffff90,
             (uint32_t)in_stack_ffffffffffffff98);
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_stack_00000018);
  if (sVar4 != 0x100) {
    uVar5 = __cxa_allocate_exception(0x28);
    imageException::imageException
              ((imageException *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    __cxa_throw(uVar5,&imageException::typeinfo,imageException::~imageException);
  }
  bVar1 = CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>
                    (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff54,iVar12),
             (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff4c,iVar11));
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98
            );
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x11bb6c);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
  uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RCX);
  puVar6 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
  pbVar7 = puVar6 + (ulong)(in_ESI * (uint)bVar1) + (ulong)(in_EDX * uVar2);
  puVar8 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RCX);
  puVar8 = puVar8 + (ulong)(in_R8D * (uint)bVar1) + (ulong)(in_R9D * uVar3);
  puVar6 = puVar8 + in_stack_00000010 * uVar3;
  while (puVar8 != puVar6) {
    puVar9 = puVar8 + in_stack_00000008 * (uint)bVar1;
    puVar13 = puVar8;
    pbVar14 = pbVar7;
    for (; puVar8 != puVar9; puVar8 = puVar8 + 1) {
      pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          (in_stack_00000018,(ulong)*pbVar7);
      *puVar8 = *pvVar10;
      pbVar7 = pbVar7 + 1;
    }
    pbVar7 = pbVar14 + uVar2;
    puVar8 = puVar13 + uVar3;
  }
  return;
}

Assistant:

void LookupTable( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                      uint32_t width, uint32_t height, const std::vector < uint8_t > & table )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );

        if( table.size() != 256u )
            throw imageException( "Lookup table size is not equal to 256" );

        const uint8_t colorCount = CommonColorCount( in, out );
        width = width * colorCount;

        OptimiseRoi( width, height, in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn  * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX  = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; ++outX, ++inX )
                (*outX) = table[*inX];
        }
    }